

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O0

int32_t __thiscall cppnet::TimerContainer::LocalMinTime(TimerContainer *this)

{
  uint32_t uVar1;
  TIME_UNIT TVar2;
  int32_t iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int32_t next_time;
  TimerContainer *this_local;
  
  iVar3 = Bitmap::GetMinAfter(&this->_bitmap,this->_cur_time);
  if (iVar3 < 0) {
    if ((this->_cur_time == 0) || (iVar3 = Bitmap::GetMinAfter(&this->_bitmap,0), iVar3 < 0)) {
      this_local._4_4_ = -1;
    }
    else {
      uVar1 = this->_size;
      uVar4 = this->_cur_time;
      TVar2 = this->_time_unit;
      uVar5 = GetIndexLeftInterval(this,(uint16_t)iVar3);
      this_local._4_4_ = ((iVar3 + uVar1) - uVar4) * TVar2 + uVar5;
    }
  }
  else {
    uVar1 = this->_cur_time;
    TVar2 = this->_time_unit;
    uVar4 = GetIndexLeftInterval(this,(uint16_t)iVar3);
    this_local._4_4_ = (iVar3 - uVar1) * TVar2 + uVar4;
  }
  return this_local._4_4_;
}

Assistant:

int32_t TimerContainer::LocalMinTime() {
    int32_t next_time = _bitmap.GetMinAfter(_cur_time);
    if (next_time >= 0) {
        return (next_time - _cur_time) * _time_unit + GetIndexLeftInterval(next_time);
    }

    if (_cur_time > 0) {
        next_time = _bitmap.GetMinAfter(0);
        
        if (next_time >= 0) {
            return (next_time + _size - _cur_time) * _time_unit + GetIndexLeftInterval(next_time);
        }
    }
    return NO_TIMER;
}